

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_opts.c
# Opt level: O2

int zt_opt_string_array(int argn,int defn,int *argc,char **argv,zt_opt_def_t *def,zt_opt_error error
                       )

{
  void_p p;
  long lVar1;
  uint in_EAX;
  char *pcVar2;
  void *pvVar3;
  size_t num;
  long lVar4;
  ulong uStack_38;
  int args_consumed;
  
  uStack_38 = (ulong)in_EAX;
  pcVar2 = zt_opt_get_value(argn,defn,argv,def,&args_consumed,error);
  if (pcVar2 != (char *)0x0) {
    p = *def[defn].cb_data;
    if (p == (void_p)0x0) {
      num = 0x10;
      lVar4 = 0;
    }
    else {
      lVar1 = 0;
      do {
        lVar4 = lVar1;
        lVar1 = lVar4 + 1;
      } while (*(long *)((long)p + lVar4 * 8) != 0);
      num = lVar4 * 8 + 0x10U & 0x7fffffff8;
    }
    pvVar3 = zt_realloc_p(p,num);
    if (pvVar3 == (void *)0x0) {
      zt_log_lprintf((zt_log_ty *)0x0,zt_log_crit,"could not allocate memory for array");
      exit(1);
    }
    pcVar2 = strdup(pcVar2);
    *(char **)((long)pvVar3 + lVar4 * 8) = pcVar2;
    *(undefined8 *)((long)pvVar3 + lVar4 * 8 + 8) = 0;
    *(void **)def[defn].cb_data = pvVar3;
  }
  return args_consumed;
}

Assistant:

int
zt_opt_string_array(int argn, int defn, int * argc, char ** argv, zt_opt_def_t * def, zt_opt_error error) {
    int    args_consumed = 0;
    char * arg           = zt_opt_get_value(argn, defn, argv, def, &args_consumed, error);

    if (arg) {
        char ** cur_array = *(char***)def[defn].cb_data;
        char ** new_array = 0;
        int     size      = 1;
        int     offt      = 0;

        if (cur_array != NULL) {
            int i = 0;
            while (cur_array[i++] != NULL) {
                ;
            }
            size = i;
            offt = i - 1;
        }

        if ((new_array = zt_realloc(char *, cur_array, size + 1)) == NULL) {
            zt_log_printf(zt_log_crit, "could not allocate memory for array");
            exit(1);
        }

        new_array[offt]             = strdup(arg);
        new_array[offt + 1]         = NULL;

        *(char***)def[defn].cb_data = new_array;
    }

    return args_consumed;
}